

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyBroadcastReceiver.h
# Opt level: O3

int __thiscall
aeron::concurrent::broadcast::CopyBroadcastReceiver::receive
          (CopyBroadcastReceiver *this,handler_t *handler)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int index;
  AtomicBuffer *pAVar4;
  BroadcastReceiver *pBVar5;
  bool bVar6;
  long *plVar7;
  SourcedException *pSVar8;
  char *pcVar9;
  size_type *psVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  uint64_t length;
  allocator local_119;
  string local_118;
  string local_f8;
  string local_d8;
  handler_t *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  lVar11 = (this->m_receiver->m_lappedCount).super___atomic_base<long>._M_i;
  bVar6 = BroadcastReceiver::receiveNext(this->m_receiver);
  iVar13 = 0;
  if (bVar6) {
    if (lVar11 != (this->m_receiver->m_lappedCount).super___atomic_base<long>._M_i) {
      pSVar8 = (SourcedException *)__cxa_allocate_exception(0x48);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"unable to keep up with broadcast buffer","");
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,"");
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
      ;
      pcVar9 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
      do {
        pcVar9 = pcVar9 + 1;
        pcVar1 = pcVar12 + 1;
        pcVar12 = pcVar12 + 1;
      } while (*pcVar9 == *pcVar1);
      std::__cxx11::string::string
                ((string *)&local_d8,pcVar12 + (*pcVar1 == '/'),(allocator *)&local_b0);
      util::SourcedException::SourcedException(pSVar8,&local_118,&local_f8,&local_d8,0x35);
      *(undefined ***)pSVar8 = &PTR__SourcedException_00163440;
      __cxa_throw(pSVar8,&util::IllegalArgumentException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    pAVar4 = this->m_receiver->m_buffer;
    iVar13 = this->m_receiver->m_recordOffset;
    local_b8 = handler;
    AtomicBuffer::boundsCheck(pAVar4,iVar13,4);
    length = (long)*(int *)(pAVar4->m_buffer + iVar13) - 8;
    iVar13 = (int)length;
    if ((int)(this->m_scratchBuffer).m_length < iVar13) {
      pSVar8 = (SourcedException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_b0,iVar13);
      std::operator+(&local_d8,"buffer required size ",&local_b0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_f8._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_f8._M_dataplus._M_p == psVar10) {
        local_f8.field_2._M_allocated_capacity = *psVar10;
        local_f8.field_2._8_8_ = plVar7[3];
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar10;
      }
      local_f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::to_string(&local_50,(this->m_scratchBuffer).m_length);
      std::operator+(&local_118,&local_f8,&local_50);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,"");
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
      ;
      pcVar9 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
      do {
        pcVar9 = pcVar9 + 1;
        pcVar1 = pcVar12 + 1;
        pcVar12 = pcVar12 + 1;
      } while (*pcVar9 == *pcVar1);
      std::__cxx11::string::string((string *)&local_70,pcVar12 + (*pcVar1 == '/'),&local_119);
      util::SourcedException::SourcedException(pSVar8,&local_118,&local_90,&local_70,0x3d);
      *(undefined ***)pSVar8 = &PTR__SourcedException_00163468;
      __cxa_throw(pSVar8,&util::IllegalStateException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    pAVar4 = this->m_receiver->m_buffer;
    iVar2 = this->m_receiver->m_recordOffset;
    AtomicBuffer::boundsCheck(pAVar4,iVar2 + 4,4);
    iVar2 = *(int *)(pAVar4->m_buffer + (long)iVar2 + 4);
    pAVar4 = this->m_receiver->m_buffer;
    lVar11 = (long)this->m_receiver->m_recordOffset + 8;
    AtomicBuffer::boundsCheck(&this->m_scratchBuffer,0,length);
    AtomicBuffer::boundsCheck(pAVar4,(index_t)lVar11,length);
    memcpy((this->m_scratchBuffer).m_buffer,pAVar4->m_buffer + lVar11,length);
    pBVar5 = this->m_receiver;
    iVar3 = pBVar5->m_capacity;
    lVar11 = pBVar5->m_cursor;
    pAVar4 = pBVar5->m_buffer;
    index = pBVar5->m_tailIntentCounterIndex;
    AtomicBuffer::boundsCheck(pAVar4,index,8);
    if (iVar3 + lVar11 <= *(long *)(pAVar4->m_buffer + index)) {
      pSVar8 = (SourcedException *)__cxa_allocate_exception(0x48);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"unable to keep up with broadcast buffer","");
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,"");
      pcVar12 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
      ;
      pcVar9 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
      do {
        pcVar9 = pcVar9 + 1;
        pcVar1 = pcVar12 + 1;
        pcVar12 = pcVar12 + 1;
      } while (*pcVar9 == *pcVar1);
      std::__cxx11::string::string
                ((string *)&local_d8,pcVar12 + (*pcVar1 == '/'),(allocator *)&local_b0);
      util::SourcedException::SourcedException(pSVar8,&local_118,&local_f8,&local_d8,0x45);
      *(undefined ***)pSVar8 = &PTR__SourcedException_00163468;
      __cxa_throw(pSVar8,&util::IllegalStateException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    std::function<void_(int,_aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
              (local_b8,iVar2,&this->m_scratchBuffer,0,iVar13);
    iVar13 = 1;
  }
  return iVar13;
}

Assistant:

int receive(const handler_t& handler)
    {
        int messagesReceived = 0;
        const long lastSeenLappedCount = m_receiver.lappedCount();

        if (m_receiver.receiveNext())
        {
            if (lastSeenLappedCount != m_receiver.lappedCount())
            {
                throw util::IllegalArgumentException("unable to keep up with broadcast buffer", SOURCEINFO);
            }

            const std::int32_t length = m_receiver.length();
            if (length > m_scratchBuffer.capacity())
            {
                throw util::IllegalStateException(
                    "buffer required size " + std::to_string(length) +
                    " but only has " + std::to_string(m_scratchBuffer.capacity()), SOURCEINFO);
            }

            const std::int32_t msgTypeId = m_receiver.typeId();
            m_scratchBuffer.putBytes(0, m_receiver.buffer(), m_receiver.offset(), length);

            if (!m_receiver.validate())
            {
                throw util::IllegalStateException("unable to keep up with broadcast buffer", SOURCEINFO);
            }

            handler(msgTypeId, m_scratchBuffer, 0, length);

            messagesReceived = 1;
        }

        return messagesReceived;
    }